

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O2

int nni_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  
  iVar1 = strcasecmp(s1,s2);
  return iVar1;
}

Assistant:

int
nni_strcasecmp(const char *s1, const char *s2)
{
#if defined(_WIN32)
	return (_stricmp(s1, s2));
#elif defined(NNG_HAVE_STRCASECMP)
	return (strcasecmp(s1, s2));
#else
	for (;;) {
		uint8_t c1 = (uint8_t) tolower(*s1++);
		uint8_t c2 = (uint8_t) tolower(*s2++);
		if (c1 == c2) {
			if (c1 == 0) {
				return (0);
			}
			continue;
		}
		return ((c1 < c2) ? -1 : 1);
	}
	return (0);
#endif
}